

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O0

void __thiscall
amrex::StateData::InterpAddBox
          (StateData *this,MultiFabCopyDescriptor *multiFabCopyDesc,
          Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_> *mfid,
          BoxList *unfillableBoxes,
          Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_> *returnedFillBoxIds,
          Box *subbox,Real time,int src_comp,int dest_comp,int num_comp,bool extrap)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  TimeCenter TVar4;
  FabArrayId *pFVar5;
  FillBoxId *pFVar6;
  Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_> *in_RCX;
  BoxList *in_RDX;
  MultiFabCopyDescriptor *in_RSI;
  long in_RDI;
  StateDescriptor *this_00;
  Box *in_R8;
  Real in_R9;
  Real in_XMM0_Qa;
  Real RVar7;
  int unaff_retaddr;
  int in_stack_00000008;
  int in_stack_00000010;
  undefined4 in_stack_00000018;
  undefined1 in_stack_00000020;
  Real teps;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffffebc;
  undefined4 uVar9;
  undefined2 in_stack_fffffffffffffec0;
  undefined2 uVar10;
  undefined2 uVar11;
  undefined2 in_stack_fffffffffffffec2;
  undefined2 uVar12;
  undefined4 in_stack_fffffffffffffec4;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  size_type in_stack_fffffffffffffed8;
  vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_> *in_stack_fffffffffffffee0;
  undefined1 local_d4 [36];
  int local_b0;
  undefined1 local_ac [40];
  int srccomp;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  FabArrayCopyDescriptor<amrex::FArrayBox> *in_stack_ffffffffffffff90;
  FabArrayId in_stack_ffffffffffffff9c;
  undefined1 in_stack_ffffffffffffffaf;
  int in_stack_ffffffffffffffb0;
  undefined3 in_stack_ffffffffffffffb4;
  uint uVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  
  srccomp = (int)((ulong)stack0xffffffffffffff78 >> 0x20);
  uVar13 = CONCAT13(in_stack_00000020,in_stack_ffffffffffffffb4) & 0x1ffffff;
  this_00 = *(StateDescriptor **)(in_RDI + 8);
  lVar16 = in_RDI;
  TVar4 = StateDescriptor::timeType(this_00);
  uVar11 = (undefined2)in_stack_00000018;
  uVar12 = (undefined2)((uint)in_stack_00000018 >> 0x10);
  if (TVar4 == Point) {
    bVar3 = std::operator==((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                            CONCAT44(in_stack_fffffffffffffec4,
                                     CONCAT22(in_stack_fffffffffffffec2,in_stack_fffffffffffffec0)),
                            (nullptr_t)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)
                           );
    if (bVar3) {
      std::vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>::resize
                (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      iVar14 = SUB84(in_XMM0_Qa,0);
      pFVar5 = Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>::operator[]
                         ((Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_> *)
                          CONCAT44(in_stack_fffffffffffffec4,
                                   CONCAT22(in_stack_fffffffffffffec2,in_stack_fffffffffffffec0)),
                          CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      FabArrayCopyDescriptor<amrex::FArrayBox>::AddBox
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff9c,
                 (Box *)CONCAT44(pFVar5->fabArrayId,in_stack_ffffffffffffff88),
                 (BoxList *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),srccomp,
                 in_stack_ffffffffffffffb0,iVar14);
      pFVar6 = Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>::operator[]
                         ((Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_> *)
                          CONCAT44(in_stack_fffffffffffffec4,CONCAT22(uVar12,uVar11)),
                          CONCAT44(in_stack_fffffffffffffebc,in_stack_00000010));
      memcpy(pFVar6,&stack0xffffffffffffff90,0x24);
    }
    else {
      Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>::operator[]
                ((Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_> *)
                 CONCAT44(in_stack_fffffffffffffec4,
                          CONCAT22(in_stack_fffffffffffffec2,in_stack_fffffffffffffec0)),
                 CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>::operator[]
                ((Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_> *)
                 CONCAT44(in_stack_fffffffffffffec4,
                          CONCAT22(in_stack_fffffffffffffec2,in_stack_fffffffffffffec0)),
                 CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      amrex::InterpAddBox(in_RSI,in_RDX,in_RCX,in_R8,(MultiFabId)(int)((ulong)lVar16 >> 0x20),
                          (MultiFabId)(int)lVar16,in_R9,in_XMM0_Qa,
                          (Real)CONCAT44(uVar13,in_stack_ffffffffffffffb0),unaff_retaddr,
                          in_stack_00000008,in_stack_00000010,(bool)in_stack_ffffffffffffffaf);
    }
  }
  else {
    dVar1 = *(double *)(in_RDI + 0xa8);
    dVar2 = *(double *)(in_RDI + 0xb8);
    uVar8 = SUB104(_DAT_0194ffa0,0);
    uVar9 = (undefined4)((unkuint10)_DAT_0194ffa0 >> 0x20);
    uVar10 = (undefined2)((unkuint10)_DAT_0194ffa0 >> 0x40);
    RVar7 = literals::operator____rt((literals *)this_00,_DAT_0194ffa0);
    register0x00001200 = (dVar1 - dVar2) * RVar7;
    if ((in_XMM0_Qa <= *(double *)(in_RDI + 0xa8) - register0x00001200) ||
       (*(double *)(in_RDI + 0xb0) + register0x00001200 <= in_XMM0_Qa)) {
      bVar3 = std::operator!=((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                              CONCAT44(in_stack_fffffffffffffec4,
                                       CONCAT22(in_stack_fffffffffffffec2,uVar10)),
                              (nullptr_t)CONCAT44(uVar9,uVar8));
      if ((!bVar3) ||
         ((in_XMM0_Qa <= *(double *)(in_RDI + 0xb8) - stack0xffffffffffffff78 ||
          (*(double *)(in_RDI + 0xc0) + stack0xffffffffffffff78 <= in_XMM0_Qa)))) {
        Error_host((char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      }
      else {
        std::vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>::resize
                  (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        iVar15 = SUB84(in_XMM0_Qa,0);
        Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>::operator[]
                  ((Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_> *)
                   CONCAT44(in_stack_fffffffffffffec4,CONCAT22(in_stack_fffffffffffffec2,uVar10)),
                   CONCAT44(uVar9,uVar8));
        dVar1 = stack0xffffffffffffff78;
        srccomp = (int)((ulong)stack0xffffffffffffff78 >> 0x20);
        iVar14 = srccomp;
        unique0x10000651 = dVar1;
        FabArrayCopyDescriptor<amrex::FArrayBox>::AddBox
                  (in_stack_ffffffffffffff90,in_stack_ffffffffffffff9c,
                   (Box *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                   (BoxList *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),iVar14,
                   in_stack_ffffffffffffffb0,iVar15);
        pFVar6 = Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>::operator[]
                           ((Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_> *)
                            CONCAT44(in_stack_fffffffffffffec4,CONCAT22(uVar12,uVar11)),
                            CONCAT44(uVar9,in_stack_00000010));
        memcpy(pFVar6,local_d4,0x24);
      }
    }
    else {
      std::vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>::resize
                (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      iVar15 = SUB84(in_XMM0_Qa,0);
      pFVar5 = Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>::operator[]
                         ((Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_> *)
                          CONCAT44(in_stack_fffffffffffffec4,
                                   CONCAT22(in_stack_fffffffffffffec2,uVar10)),CONCAT44(uVar9,uVar8)
                         );
      dVar1 = stack0xffffffffffffff78;
      local_b0 = pFVar5->fabArrayId;
      srccomp = (int)((ulong)stack0xffffffffffffff78 >> 0x20);
      iVar14 = srccomp;
      unique0x10000659 = dVar1;
      FabArrayCopyDescriptor<amrex::FArrayBox>::AddBox
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff9c,
                 (Box *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                 (BoxList *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),iVar14,
                 in_stack_ffffffffffffffb0,iVar15);
      pFVar6 = Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>::operator[]
                         ((Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_> *)
                          CONCAT44(in_stack_fffffffffffffec4,CONCAT22(uVar12,uVar11)),
                          CONCAT44(uVar9,in_stack_00000010));
      memcpy(pFVar6,local_ac,0x24);
    }
  }
  return;
}

Assistant:

void
StateData::InterpAddBox (MultiFabCopyDescriptor& multiFabCopyDesc,
                         Vector<MultiFabId>&      mfid,
                         BoxList*                unfillableBoxes,
                         Vector<FillBoxId>&       returnedFillBoxIds,
                         const Box&              subbox,
                         Real                    time,
                         int                     src_comp,
                         int                     dest_comp,
                         int                     num_comp,
                         bool                    extrap)
{
    if (desc->timeType() == StateDescriptor::Point)
    {
        if (old_data == nullptr)
        {
            returnedFillBoxIds.resize(1);
            returnedFillBoxIds[0] = multiFabCopyDesc.AddBox(mfid[MFNEWDATA],
                                                            subbox,
                                                            unfillableBoxes,
                                                            src_comp,
                                                            dest_comp,
                                                            num_comp);
        }
        else
        {
            amrex::InterpAddBox(multiFabCopyDesc,
                                unfillableBoxes,
                                returnedFillBoxIds,
                                subbox,
                                mfid[MFOLDDATA],
                                mfid[MFNEWDATA],
                                old_time.start,
                                new_time.start,
                                time,
                                src_comp,
                                dest_comp,
                                num_comp,
                                extrap);
        }
    }
    else
    {
        const Real teps = (new_time.start - old_time.start)*1.e-3_rt;

        if (time > new_time.start-teps && time < new_time.stop+teps)
        {
            returnedFillBoxIds.resize(1);
            returnedFillBoxIds[0] = multiFabCopyDesc.AddBox(mfid[MFNEWDATA],
                                                            subbox,
                                                            unfillableBoxes,
                                                            src_comp,
                                                            dest_comp,
                                                            num_comp);
        }
        else if (old_data != nullptr        &&
                 time > old_time.start-teps &&
                 time < old_time.stop+teps)
        {
            returnedFillBoxIds.resize(1);
            returnedFillBoxIds[0] = multiFabCopyDesc.AddBox(mfid[MFOLDDATA],
                                                            subbox,
                                                            unfillableBoxes,
                                                            src_comp,
                                                            dest_comp,
                                                            num_comp);
        }
        else
        {
            amrex::Error("StateData::Interp(): cannot interp");
        }
   }
}